

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O2

void __thiscall DataSet::toFile(DataSet *this,string *file_name)

{
  runtime_error *this_00;
  ulong uVar1;
  long lVar2;
  size_t f;
  ulong uVar3;
  size_t s;
  ofstream file;
  int aiStack_210 [120];
  
  std::ofstream::ofstream(&file,(string *)file_name,_S_bin);
  if (*(int *)((long)aiStack_210 + *(long *)(_file + -0x18)) == 0) {
    std::ostream::write((char *)&file,(long)this);
    s = ((long)(this->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(this->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18;
    std::ostream::write((char *)&file,(long)&s);
    for (uVar1 = 0;
        uVar1 < (ulong)(((long)(this->vectors).
                               super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->vectors).
                              super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x18); uVar1 = uVar1 + 1) {
      lVar2 = 0;
      for (uVar3 = 0; uVar3 < this->num_features; uVar3 = uVar3 + 1) {
        std::ostream::write((char *)&file,
                            *(long *)&(this->vectors).
                                      super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar1].values.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl +
                            lVar2);
        lVar2 = lVar2 + 4;
      }
    }
    std::ofstream::~ofstream(&file);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Could not write to file.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DataSet::toFile(std::string file_name) {
  // Open the file
  std::ofstream file(file_name, std::ios::binary);

  if (file.good()) {
    // Write number of features
    file.write((char *) &num_features, sizeof(size_t));
    // Write size
    auto s = size();
    file.write((char *) &s, sizeof(size_t));

    // Write vectors
    for (size_t v = 0; v < size(); v++) {
      for (size_t f = 0; f < num_features; f++) {
        file.write((char *) &vector(v)[f], sizeof(float));
      }
    }
  } else {
    throw std::runtime_error("Could not write to file.");
  }
}